

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O1

void __thiscall Maze::startCellEndCells(Maze *this)

{
  pointer pvVar1;
  pointer pvVar2;
  char *pcVar3;
  char *pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  pointer pcVar7;
  ulong uVar8;
  tuple<int,_int> *ptVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  pointer *ppcVar16;
  
  pvVar1 = (this->MazeMatrix).
           super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->MazeMatrix).
           super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar10 = ((long)pvVar2 - (long)pvVar1 >> 3) * -0x5555555555555555;
  if (pvVar2 == pvVar1) {
    lVar15 = 0;
  }
  else {
    ppcVar16 = &(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    lVar12 = 0;
    lVar15 = 0;
    do {
      pcVar3 = ((_Vector_impl_data *)(ppcVar16 + -1))->_M_start;
      pcVar4 = *ppcVar16;
      uVar8 = (long)pcVar4 - (long)pcVar3;
      if (uVar8 == 0) {
        uVar13 = 0;
        goto LAB_00102faa;
      }
      lVar14 = lVar15;
      if (*pcVar3 == '0') {
        if (lVar15 == 0) {
          lVar14 = 1;
        }
        (&this->startCell)[lVar15].super__Tuple_impl<0UL,_int,_int>.
        super__Head_base<0UL,_int,_false>._M_head_impl = (int)lVar12;
        (&this->startCell)[lVar15].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl = 0;
      }
      uVar13 = uVar8 - 1;
      if (pcVar4 == pcVar3) goto LAB_00102faa;
      lVar15 = lVar14;
      if (pcVar3[uVar13] == '0') {
        if (lVar14 == 0) {
          lVar15 = 1;
        }
        (&this->startCell)[lVar14].super__Tuple_impl<0UL,_int,_int>.
        super__Head_base<0UL,_int,_false>._M_head_impl = (int)lVar12;
        (&this->startCell)[lVar14].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl = (int)uVar13;
      }
      lVar12 = lVar12 + 1;
      ppcVar16 = ppcVar16 + 3;
    } while (uVar10 + (uVar10 == 0) != lVar12);
  }
  if (pvVar2 != pvVar1) {
    pcVar5 = (pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar6 = (pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar13 = 0;
    do {
      if ((long)pcVar6 - (long)pcVar5 == uVar13) {
        return;
      }
      if (pcVar5[uVar13] == '0') {
        lVar12 = lVar15;
        if (lVar15 == 0) {
          lVar12 = 1;
        }
        (&this->startCell)[lVar15].super__Tuple_impl<0UL,_int,_int>.
        super__Head_base<0UL,_int,_false>._M_head_impl = 0;
        (&this->startCell)[lVar15].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl = (int)uVar13;
        lVar15 = lVar12;
      }
      pcVar7 = pvVar1[uVar10 - 1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = (long)pvVar1[uVar10 - 1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar7;
      if (uVar8 <= uVar13) goto LAB_00102faa;
      if (pcVar7[uVar13] == '0') {
        iVar11 = (int)(uVar10 - 1);
        if (lVar15 == 0) {
          (this->startCell).super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>.
          _M_head_impl = iVar11;
          lVar15 = 1;
          ptVar9 = &this->startCell;
        }
        else {
          (this->endCell).super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>.
          _M_head_impl = iVar11;
          ptVar9 = &this->endCell;
        }
        (ptVar9->super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl = (int)uVar13;
      }
      uVar13 = uVar13 + 1;
    } while (pvVar2 != pvVar1);
  }
  uVar13 = 0;
  uVar8 = uVar10;
LAB_00102faa:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar13,
             uVar8);
}

Assistant:

void Maze::startCellEndCells() {
//looks for the start cell and the end cell.
//scans the edges, and picks the first one it comes accoss as the start cell. The next one
// would be the ending cell.


    bool startFound = false;
    for(int i = 0; i < MazeMatrix.size(); i++)
    {
        if(MazeMatrix.at(i).at(0) == '0'){
            if(!startFound){
                startCell = std::make_tuple (i,0);
                startFound = true;
            }
            else{
                endCell = std::make_tuple(i,0);
            }
        }
        if(MazeMatrix.at(i).at(MazeMatrix.at(i).size()-1) == '0'){
            if(!startFound){
                startCell = std::make_tuple (i,MazeMatrix.at(i).size()-1);
                startFound = true;
            }
            else{
                endCell = std::make_tuple(i,MazeMatrix.at(i).size()-1);
            }
        }
    }
    //checking top and bottom
    for(int i = 0; i < MazeMatrix.at(0).size(); i++){
        if(MazeMatrix.at(0).at(i) == '0'){
            if(!startFound){
                startCell = std::make_tuple (0, i);
                startFound = true;
            }
            else{
                endCell = std::make_tuple(0, i);
            }
        }
        if(MazeMatrix.at(MazeMatrix.size() -1).at(i) == '0'){
            if(!startFound){
                startCell = std::make_tuple(MazeMatrix.size()-1, i);
                startFound = true;
            }
            else {
                endCell = std::make_tuple(MazeMatrix.size() - 1, i);
            }

        }

    }
 }